

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O0

ostream * cppqc::printInput<Rectangle>(ostream *out,tuple<Rectangle> *in)

{
  ostream *poVar1;
  ostream *in_RDI;
  Rectangle *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  poVar1 = std::operator<<(in_RDI,"  0: ");
  std::get<0ul,Rectangle>((tuple<Rectangle> *)0x1194ee);
  prettyPrint<Rectangle>(in_stack_ffffffffffffff98);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& printInput(std::ostream& out, const std::tuple<T0>& in) {
  return out << "  0: " << prettyPrint(std::get<0>(in)) << '\n' << std::flush;
}